

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

void icu_63::anon_unknown_19::initStaticTimeZones(void)

{
  SimpleTimeZone *pSVar1;
  code *size;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78 [3];
  UChar *local_60;
  UnicodeString local_50;
  
  size = timeZone_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONE,timeZone_cleanup);
  pSVar1 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)size);
  if (pSVar1 == (SimpleTimeZone *)0x0) {
    _UNKNOWN_ZONE = (TimeZone *)0x0;
  }
  else {
    local_78[0].p_ = L"Etc/Unknown";
    UnicodeString::UnicodeString(&local_50,'\x01',local_78,0xb);
    size = (code *)0x0;
    SimpleTimeZone::SimpleTimeZone(pSVar1,0,&local_50);
    _UNKNOWN_ZONE = (TimeZone *)pSVar1;
    UnicodeString::~UnicodeString(&local_50);
    local_60 = local_78[0].p_;
  }
  pSVar1 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)size);
  if (pSVar1 == (SimpleTimeZone *)0x0) {
    _GMT = (TimeZone *)0x0;
  }
  else {
    local_80.p_ = L"GMT";
    UnicodeString::UnicodeString(&local_50,'\x01',&local_80,3);
    SimpleTimeZone::SimpleTimeZone(pSVar1,0,&local_50);
    _GMT = (TimeZone *)pSVar1;
    UnicodeString::~UnicodeString(&local_50);
  }
  return;
}

Assistant:

void U_CALLCONV initStaticTimeZones() {
    // Initialize _GMT independently of other static data; it should
    // be valid even if we can't load the time zone UDataMemory.
    ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONE, timeZone_cleanup);
    _UNKNOWN_ZONE = new SimpleTimeZone(0, UnicodeString(TRUE, UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH));
    _GMT = new SimpleTimeZone(0, UnicodeString(TRUE, GMT_ID, GMT_ID_LENGTH));
}